

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFieldName_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,
          Reflection *reflection,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  MessageOptions *this_00;
  Descriptor *pDVar3;
  Descriptor *pDVar4;
  string *psVar5;
  AlphaNum local_150;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  FieldDescriptor *local_30;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  FieldValuePrinter *this_local;
  
  local_30 = field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  this_local = (FieldValuePrinter *)__return_storage_ptr__;
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    pDVar4 = FieldDescriptor::containing_type(local_30);
    this_00 = Descriptor::options(pDVar4);
    bVar1 = MessageOptions::message_set_wire_format(this_00);
    if (((bVar1) && (TVar2 = FieldDescriptor::type(local_30), TVar2 == TYPE_MESSAGE)) &&
       (bVar1 = FieldDescriptor::is_optional(local_30), bVar1)) {
      pDVar4 = FieldDescriptor::extension_scope(local_30);
      pDVar3 = FieldDescriptor::message_type(local_30);
      if (pDVar4 == pDVar3) {
        strings::AlphaNum::AlphaNum(&local_60,"[");
        pDVar4 = FieldDescriptor::message_type(local_30);
        psVar5 = Descriptor::full_name_abi_cxx11_(pDVar4);
        strings::AlphaNum::AlphaNum(&local_90,psVar5);
        strings::AlphaNum::AlphaNum(&local_c0,"]");
        StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_60,&local_90,&local_c0,
                          (AlphaNum *)field);
        return __return_storage_ptr__;
      }
    }
    strings::AlphaNum::AlphaNum(&local_f0,"[");
    psVar5 = FieldDescriptor::full_name_abi_cxx11_(local_30);
    strings::AlphaNum::AlphaNum(&local_120,psVar5);
    strings::AlphaNum::AlphaNum(&local_150,"]");
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_f0,&local_120,&local_150,
                      (AlphaNum *)field);
  }
  else {
    TVar2 = FieldDescriptor::type(local_30);
    if (TVar2 == TYPE_GROUP) {
      pDVar4 = FieldDescriptor::message_type(local_30);
      psVar5 = Descriptor::name_abi_cxx11_(pDVar4);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
    }
    else {
      psVar5 = FieldDescriptor::name_abi_cxx11_(local_30);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintFieldName(
    const Message& message,
    const Reflection* reflection,
    const FieldDescriptor* field) const {
  if (field->is_extension()) {
    // We special-case MessageSet elements for compatibility with proto1.
    if (field->containing_type()->options().message_set_wire_format()
        && field->type() == FieldDescriptor::TYPE_MESSAGE
        && field->is_optional()
        && field->extension_scope() == field->message_type()) {
      return StrCat("[", field->message_type()->full_name(), "]");
    } else {
      return StrCat("[", field->full_name(), "]");
    }
  } else if (field->type() == FieldDescriptor::TYPE_GROUP) {
    // Groups must be serialized with their original capitalization.
    return field->message_type()->name();
  } else {
    return field->name();
  }
}